

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* phosg::split_context
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s,char delim,size_t max_splits)

{
  char cVar1;
  byte bVar2;
  runtime_error *this;
  undefined7 in_register_00000011;
  ulong uVar3;
  ulong __pos;
  bool bVar4;
  vector<char,_std::allocator<char>_> paren_stack;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined4 local_5c;
  vector<char,_std::allocator<char>_> local_58;
  ulong local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000011,delim);
  __pos = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (s->_M_string_length != 0) {
    __pos = 0;
    uVar3 = 0;
    bVar4 = false;
    local_38 = max_splits;
    do {
      if (((bool)(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish | bVar4)) ||
         ((s->_M_dataplus)._M_p[uVar3] !=
          local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish[-1])) {
        if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start ==
            local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish) {
          bVar4 = false;
        }
        else {
          cVar1 = local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
          if (bVar4 || cVar1 != '\'' && cVar1 != '\"') {
            bVar4 = false;
          }
          else {
            bVar4 = (s->_M_dataplus)._M_p[uVar3] == '\\';
          }
          if ((cVar1 == '\"') || (cVar1 == '\'')) goto LAB_00110d04;
        }
        bVar2 = (s->_M_dataplus)._M_p[uVar3];
        if (bVar2 < 0x3c) {
          if (bVar2 == 0x22) {
            local_80._M_dataplus._M_p._0_1_ = 0x22;
            ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                      (&local_58,(char *)&local_80);
          }
          else if (bVar2 == 0x27) {
            local_80._M_dataplus._M_p._0_1_ = 0x27;
            ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                      (&local_58,(char *)&local_80);
          }
          else if (bVar2 == 0x28) {
            local_80._M_dataplus._M_p._0_1_ = 0x29;
            ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                      (&local_58,(char *)&local_80);
          }
          else {
LAB_00110c6d:
            if ((bVar2 == (byte)local_5c &&
                 local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish) &&
               ((local_38 == 0 ||
                ((ulong)((long)(__return_storage_ptr__->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5) < local_38)))) {
              ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_80,s,__pos,uVar3 - __pos);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,&local_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
                  &local_80.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                         local_80._M_dataplus._M_p._0_1_),
                                local_80.field_2._M_allocated_capacity + 1);
              }
              __pos = uVar3 + 1;
            }
          }
        }
        else if (bVar2 == 0x3c) {
          local_80._M_dataplus._M_p._0_1_ = 0x3e;
          ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    (&local_58,(char *)&local_80);
        }
        else if (bVar2 == 0x5b) {
          local_80._M_dataplus._M_p._0_1_ = 0x5d;
          ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    (&local_58,(char *)&local_80);
        }
        else {
          if (bVar2 != 0x7b) goto LAB_00110c6d;
          local_80._M_dataplus._M_p._0_1_ = 0x7d;
          ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    (&local_58,(char *)&local_80);
        }
      }
      else {
        local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        bVar4 = false;
      }
LAB_00110d04:
      uVar3 = uVar3 + 1;
    } while (uVar3 < s->_M_string_length);
    if (uVar3 < __pos) goto LAB_00110d59;
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_80,s,__pos,0xffffffffffffffff);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
      &local_80.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                    local_80.field_2._M_allocated_capacity + 1);
  }
LAB_00110d59:
  if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,"unbalanced parentheses in split_context");
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<string> split_context(const string& s, char delim, size_t max_splits) {
  vector<string> ret;
  vector<char> paren_stack;
  bool char_is_escaped = false;

  size_t z, last_start = 0;
  for (z = 0; z < s.size(); z++) {
    if (!char_is_escaped && !paren_stack.empty() && (s[z] == paren_stack.back())) {
      paren_stack.pop_back();
      continue;
    }
    bool in_quoted_string = (!paren_stack.empty() && ((paren_stack.back() == '\'') || (paren_stack.back() == '\"')));
    if (char_is_escaped) {
      char_is_escaped = false;
    } else if (in_quoted_string && s[z] == '\\') {
      char_is_escaped = true;
    }
    if (!in_quoted_string) {
      if (s[z] == '(') {
        paren_stack.push_back(')');
      } else if (s[z] == '[') {
        paren_stack.push_back(']');
      } else if (s[z] == '{') {
        paren_stack.push_back('}');
      } else if (s[z] == '<') {
        paren_stack.push_back('>');
      } else if (s[z] == '\'') {
        paren_stack.push_back('\'');
      } else if (s[z] == '\"') {
        paren_stack.push_back('\"');
      } else if (paren_stack.empty() && (s[z] == delim) && (!max_splits || (ret.size() < max_splits))) {
        ret.push_back(s.substr(last_start, z - last_start));
        last_start = z + 1;
      }
    }
  }

  if (z >= last_start) {
    ret.push_back(s.substr(last_start));
  }

  if (paren_stack.size()) {
    throw runtime_error("unbalanced parentheses in split_context");
  }

  return ret;
}